

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFExpression.cpp
# Opt level: O3

int __thiscall
llvm::DWARFExpression::Operation::verify
          (Operation *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  Encoding EVar1;
  DWARFAbbreviationDeclaration *pDVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  undefined8 unaff_RBX;
  bool bVar6;
  DWARFDie DVar7;
  
  iVar5 = (int)CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
  lVar4 = 0;
  bVar6 = true;
  do {
    EVar1 = (this->Desc).Op[lVar4];
    if (EVar1 == BaseTypeRef) {
      DVar7 = DWARFUnit::getDIEForOffset
                        ((DWARFUnit *)ctx,this->Operands[lVar4] + *(long *)(ctx + 0x18));
      if ((((DVar7.U == (DWARFUnit *)0x0) || (DVar7.Die == (DWARFDebugInfoEntry *)0x0)) ||
          (pDVar2 = (DVar7.Die)->AbbrevDecl, pDVar2 == (DWARFAbbreviationDeclaration *)0x0)) ||
         (pDVar2->Tag != DW_TAG_base_type)) {
        this->Error = true;
        return 0;
      }
    }
    else if (EVar1 == SizeNA) {
      return iVar5;
    }
    lVar4 = 1;
    bVar3 = !bVar6;
    bVar6 = false;
    if (bVar3) {
      return iVar5;
    }
  } while( true );
}

Assistant:

bool DWARFExpression::Operation::verify(DWARFUnit *U) {

  for (unsigned Operand = 0; Operand < 2; ++Operand) {
    unsigned Size = Desc.Op[Operand];

    if (Size == Operation::SizeNA)
      break;

    if (Size == Operation::BaseTypeRef) {
      auto Die = U->getDIEForOffset(U->getOffset() + Operands[Operand]);
      if (!Die || Die.getTag() != dwarf::DW_TAG_base_type) {
        Error = true;
        return false;
      }
    }
  }

  return true;
}